

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cc
# Opt level: O3

bool Minisat::parseOptions(int *argc,char **argv,bool strict)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  vec<Minisat::Option_*> *pvVar4;
  long lVar5;
  long lVar6;
  uint extraout_EDX;
  long lVar7;
  int k;
  char *pcVar8;
  char cVar9;
  Option *pOVar10;
  char *pcVar11;
  int local_48;
  
  iVar3 = *argc;
  bVar2 = false;
  local_48 = 0;
  if (1 < iVar3) {
    local_48 = 1;
    bVar2 = false;
    lVar7 = 1;
    pOVar10 = (Option *)argc;
    do {
      lVar5 = lVar7;
      iVar3 = (int)pOVar10;
      pcVar8 = argv[lVar5];
      if ((*pcVar8 == '-') && (pcVar8[1] == '-')) {
        lVar7 = 0;
        cVar9 = *Option::getHelpPrefixString()::help_prefix_str;
        while (cVar9 != '\0') {
          if (pcVar8[lVar7 + 2] != cVar9) goto LAB_0012afcd;
          lVar6 = lVar7 + 1;
          lVar7 = lVar7 + 1;
          cVar9 = Option::getHelpPrefixString()::help_prefix_str[lVar6];
        }
        cVar9 = 'h';
        lVar6 = 0;
        do {
          if (pcVar8[lVar6 + lVar7 + 2] != cVar9) goto LAB_0012afcd;
          cVar9 = "help"[lVar6 + 1];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
        if (pcVar8[lVar7 + 6] == '\0') {
LAB_0012b07a:
          printUsageAndExit(iVar3,argv,false);
          if (Option::getUsageString()::usage_str != (char *)0x0) {
            fprintf(_stderr,Option::getUsageString()::usage_str,*argv);
          }
          pvVar4 = Option::getOptionList();
          sort<Minisat::Option*,Minisat::Option::OptionLt>(pvVar4->data,pvVar4->sz);
          pvVar4 = Option::getOptionList();
          if (0 < pvVar4->sz) {
            lVar7 = 0;
            pcVar8 = (char *)0x0;
            pcVar11 = (char *)0x0;
            do {
              pvVar4 = Option::getOptionList();
              pcVar1 = pvVar4->data[lVar7]->category;
              pvVar4 = Option::getOptionList();
              if (pcVar1 == pcVar8) {
                if (pvVar4->data[lVar7]->type_name != pcVar11) {
                  fputc(10,_stderr);
                }
              }
              else {
                fprintf(_stderr,"\n%s OPTIONS:\n\n",pcVar1);
              }
              pvVar4 = Option::getOptionList();
              (*pvVar4->data[lVar7]->_vptr_Option[3])
                        (pvVar4->data[lVar7],(ulong)(extraout_EDX & 0xff));
              pvVar4 = Option::getOptionList();
              pcVar8 = pvVar4->data[lVar7]->category;
              pvVar4 = Option::getOptionList();
              pcVar11 = pvVar4->data[lVar7]->type_name;
              lVar7 = lVar7 + 1;
              pvVar4 = Option::getOptionList();
            } while (lVar7 < pvVar4->sz);
          }
          fwrite("\nHELP OPTIONS:\n\n",0x10,1,_stderr);
          fprintf(_stderr,"  --%shelp        Print help message.\n",
                  Option::getHelpPrefixString()::help_prefix_str);
          fprintf(_stderr,"  --%shelp-verb   Print verbose help message.\n",
                  Option::getHelpPrefixString()::help_prefix_str);
          fputc(10,_stderr);
          exit(0);
        }
        cVar9 = '-';
        lVar6 = 0;
        while (pcVar8[lVar6 + lVar7 + 6] == cVar9) {
          cVar9 = "-verb"[lVar6 + 1];
          lVar6 = lVar6 + 1;
          if (lVar6 == 5) {
            printUsageAndExit(iVar3,argv,true);
LAB_0012b072:
            iVar3 = (int)pOVar10;
            parseOptions();
            goto LAB_0012b07a;
          }
        }
        bVar2 = true;
      }
      else {
LAB_0012afcd:
        lVar7 = 0;
        do {
          pvVar4 = Option::getOptionList();
          if (pvVar4->sz <= lVar7) {
            pOVar10 = (Option *)argv[lVar5];
            if ((strict) && (*(char *)&pOVar10->_vptr_Option == '-')) goto LAB_0012b072;
            lVar7 = (long)local_48;
            local_48 = local_48 + 1;
            argv[lVar7] = (char *)pOVar10;
            break;
          }
          pvVar4 = Option::getOptionList();
          pOVar10 = pvVar4->data[lVar7];
          iVar3 = (*pOVar10->_vptr_Option[2])(pOVar10,argv[lVar5]);
          lVar7 = lVar7 + 1;
        } while ((char)iVar3 == '\0');
      }
      iVar3 = *argc;
      lVar7 = lVar5 + 1;
    } while (lVar5 + 1 < (long)iVar3);
    local_48 = local_48 + ~(uint)lVar5;
  }
  *argc = iVar3 + local_48;
  return bVar2;
}

Assistant:

bool MERGESAT_NSPACE::parseOptions(int &argc, char **argv, bool strict)
{
    int i, j;
    bool ret = false;
    for (i = j = 1; i < argc; i++) {
        const char *str = argv[i];
        if (match(str, "--") && match(str, Option::getHelpPrefixString()) && match(str, "help")) {
            if (*str == '\0')
                printUsageAndExit(argc, argv);
            else if (match(str, "-verb"))
                printUsageAndExit(argc, argv, true);
            ret = true;
        } else {
            bool parsed_ok = false;

            for (int k = 0; !parsed_ok && k < Option::getOptionList().size(); k++) {
                parsed_ok = Option::getOptionList()[k]->parse(argv[i]);

                // fprintf(stderr, "checking %d: %s against flag <%s> (%s)\n", i, argv[i], Option::getOptionList()[k]->name, parsed_ok ? "ok" : "skip");
            }

            if (!parsed_ok) {
                if (strict && match(argv[i], "-")) {
                    fprintf(stderr, "ERROR! Unknown flag \"%s\". Use '--%shelp' for help.\n", argv[i],
                            Option::getHelpPrefixString()),
                    exit(1);
                } else {
                    argv[j++] = argv[i];
                }
            }
        }
    }

    argc -= (i - j);

    return ret; /* indicate whether --help was specified */
}